

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_cmp_mpi(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = X->n;
  if (uVar3 != 0) {
    do {
      if (X->p[uVar3 - 1] != 0) goto LAB_0011b138;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = 0;
LAB_0011b138:
  uVar2 = Y->n;
  if (uVar2 != 0) {
    do {
      if (Y->p[uVar2 - 1] != 0) goto LAB_0011b154;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  uVar2 = 0;
LAB_0011b154:
  if (uVar2 == 0 && uVar3 == 0) {
    return 0;
  }
  if (uVar3 <= uVar2) {
    if (uVar3 < uVar2) {
      return -Y->s;
    }
    iVar1 = X->s;
    if (iVar1 < 1) {
      if (iVar1 != 0 && 0 < Y->s) {
        return -1;
      }
    }
    else if (Y->s < 0) {
      return 1;
    }
    while( true ) {
      bVar4 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar4) {
        return 0;
      }
      if (Y->p[uVar3] < X->p[uVar3]) break;
      if (X->p[uVar3] < Y->p[uVar3]) {
        return -iVar1;
      }
    }
    return iVar1;
  }
  return X->s;
}

Assistant:

int mbedtls_mpi_cmp_mpi( const mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    size_t i, j;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );

    for( i = X->n; i > 0; i-- )
        if( X->p[i - 1] != 0 )
            break;

    for( j = Y->n; j > 0; j-- )
        if( Y->p[j - 1] != 0 )
            break;

    if( i == 0 && j == 0 )
        return( 0 );

    if( i > j ) return(  X->s );
    if( j > i ) return( -Y->s );

    if( X->s > 0 && Y->s < 0 ) return(  1 );
    if( Y->s > 0 && X->s < 0 ) return( -1 );

    for( ; i > 0; i-- )
    {
        if( X->p[i - 1] > Y->p[i - 1] ) return(  X->s );
        if( X->p[i - 1] < Y->p[i - 1] ) return( -X->s );
    }

    return( 0 );
}